

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stmt.h
# Opt level: O3

void __thiscall
enact::VariableStmt::VariableStmt
          (VariableStmt *this,Token *keyword,Token *name,
          unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *typeName,
          unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *initializer)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  (this->super_Stmt)._vptr_Stmt = (_func_int **)&PTR__VariableStmt_00127128;
  (this->keyword).type = keyword->type;
  paVar1 = &(this->keyword).lexeme.field_2;
  (this->keyword).lexeme._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (keyword->lexeme)._M_dataplus._M_p;
  paVar2 = &(keyword->lexeme).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(keyword->lexeme).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->keyword).lexeme.field_2 + 8) = uVar4;
  }
  else {
    (this->keyword).lexeme._M_dataplus._M_p = pcVar3;
    (this->keyword).lexeme.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->keyword).lexeme._M_string_length = (keyword->lexeme)._M_string_length;
  (keyword->lexeme)._M_dataplus._M_p = (pointer)paVar2;
  (keyword->lexeme)._M_string_length = 0;
  (keyword->lexeme).field_2._M_local_buf[0] = '\0';
  (this->keyword).col = keyword->col;
  (this->keyword).line = keyword->line;
  (this->name).type = name->type;
  paVar1 = &(this->name).lexeme.field_2;
  (this->name).lexeme._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (name->lexeme)._M_dataplus._M_p;
  paVar2 = &(name->lexeme).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(name->lexeme).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->name).lexeme.field_2 + 8) = uVar4;
  }
  else {
    (this->name).lexeme._M_dataplus._M_p = pcVar3;
    (this->name).lexeme.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->name).lexeme._M_string_length = (name->lexeme)._M_string_length;
  (name->lexeme)._M_dataplus._M_p = (pointer)paVar2;
  (name->lexeme)._M_string_length = 0;
  (name->lexeme).field_2._M_local_buf[0] = '\0';
  (this->name).col = name->col;
  (this->name).line = name->line;
  (this->typeName)._M_t.
  super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>._M_t.
  super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>.
  super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl =
       (typeName->_M_t).
       super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>.
       _M_t.
       super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>.
       super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl;
  (typeName->_M_t).
  super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>._M_t.
  super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>.
  super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl = (Typename *)0x0;
  (this->initializer)._M_t.super___uniq_ptr_impl<enact::Expr,_std::default_delete<enact::Expr>_>.
  _M_t.super__Tuple_impl<0UL,_enact::Expr_*,_std::default_delete<enact::Expr>_>.
  super__Head_base<0UL,_enact::Expr_*,_false>._M_head_impl =
       (initializer->_M_t).super___uniq_ptr_impl<enact::Expr,_std::default_delete<enact::Expr>_>.
       _M_t.super__Tuple_impl<0UL,_enact::Expr_*,_std::default_delete<enact::Expr>_>.
       super__Head_base<0UL,_enact::Expr_*,_false>._M_head_impl;
  (initializer->_M_t).super___uniq_ptr_impl<enact::Expr,_std::default_delete<enact::Expr>_>._M_t.
  super__Tuple_impl<0UL,_enact::Expr_*,_std::default_delete<enact::Expr>_>.
  super__Head_base<0UL,_enact::Expr_*,_false>._M_head_impl = (Expr *)0x0;
  return;
}

Assistant:

VariableStmt(
                Token keyword,
                Token name,
                std::unique_ptr<const Typename> typeName,
                std::unique_ptr<Expr> initializer) :
                keyword{std::move(keyword)},
                name{std::move(name)},
                typeName{std::move(typeName)},
                initializer{std::move(initializer)} {}